

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gausslobatto.hpp
# Opt level: O0

tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
IntegratorXX::quadrature_traits<IntegratorXX::GaussLobatto<double,_double>,_void>::generate
          (tuple<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,size_t npts)

{
  point_type pVar1;
  size_t sVar2;
  pointer __n;
  long lVar3;
  runtime_error *this;
  reference pvVar4;
  tuple<double&,std::_Swallow_assign_const&,double&> *this_00;
  double dVar5;
  double extraout_XMM0_Qa;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  weight_type wgt;
  point_type pt;
  tuple<double,_double,_double> local_d8;
  int local_bc;
  undefined4 local_b8;
  int it;
  int maxit;
  bool converged;
  point_type p_nm2;
  point_type p_nm1;
  point_type z_old;
  point_type z;
  point_type i;
  size_t idx;
  size_t mid;
  weight_type two_ov_nnm1;
  double eps;
  undefined1 local_60 [8];
  weight_container weights;
  allocator<double> local_31;
  undefined1 local_30 [8];
  point_container points;
  size_t npts_local;
  
  points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)npts;
  std::allocator<double>::allocator(&local_31);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,npts,&local_31);
  std::allocator<double>::~allocator(&local_31);
  __n = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage;
  std::allocator<double>::allocator((allocator<double> *)((long)&eps + 7));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,(size_type)__n,
             (allocator<double> *)((long)&eps + 7));
  std::allocator<double>::~allocator((allocator<double> *)((long)&eps + 7));
  two_ov_nnm1 = std::numeric_limits<double>::epsilon();
  auVar6._8_4_ = (int)((ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage >> 0x20);
  auVar6._0_8_ = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  auVar6._12_4_ = 0x45300000;
  dVar5 = (auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,
                            (int)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage) - 4503599627370496.0);
  mid = (size_t)(2.0 / (dVar5 * (dVar5 - 1.0)));
  idx = (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 1U >> 1;
  i = 4.94065645841247e-324;
  do {
    if (idx <= (ulong)i) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_30,0);
      sVar2 = mid;
      *pvVar4 = -1.0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_60,0);
      *pvVar4 = (value_type)sVar2;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_30,
                          (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - 1);
      sVar2 = mid;
      *pvVar4 = 1.0;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_60,
                          (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage - 1);
      *pvVar4 = (value_type)sVar2;
      if (((ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) == 1) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)local_30,
                            (ulong)points.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage >> 1);
        *pvVar4 = 0.0;
      }
      std::
      make_tuple<std::vector<double,std::allocator<double>>&,std::vector<double,std::allocator<double>>&>
                (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_30,
                 (vector<double,_std::allocator<double>_> *)local_60);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_60);
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)local_30);
      return __return_storage_ptr__;
    }
    lVar3 = ~(ulong)i +
            (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    auVar7._8_4_ = (int)((ulong)lVar3 >> 0x20);
    auVar7._0_8_ = lVar3;
    auVar7._12_4_ = 0x45300000;
    z = (auVar7._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar3) - 4503599627370496.0);
    auVar9._8_4_ = (int)((ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage >> 0x20);
    auVar9._0_8_ = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    auVar9._12_4_ = 0x45300000;
    z_old = cos((z * 3.141592653589793) /
                (((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,
                                   (int)points.super__Vector_base<double,_std::allocator<double>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage) -
                 4503599627370496.0)) - 1.0));
    p_nm1 = -2.0;
    it._3_1_ = 0;
    local_b8 = 100;
    for (local_bc = 0; local_bc < 100; local_bc = local_bc + 1) {
      eval_Pn<double>(&local_d8,z_old,
                      (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage - 1);
      this_00 = (tuple<double&,std::_Swallow_assign_const&,double&> *)&pt;
      std::tie<double,std::_Swallow_assign_const,double>
                ((tuple<double_&,_const_std::_Swallow_assign_&,_double_&> *)this_00,&p_nm2,
                 (_Swallow_assign *)&std::ignore,(double *)&maxit);
      std::tuple<double&,std::_Swallow_assign_const&,double&>::operator=(this_00,&local_d8);
      p_nm1 = z_old;
      auVar8._8_4_ = (int)((ulong)points.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage >> 0x20);
      auVar8._0_8_ = points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
      auVar8._12_4_ = 0x45300000;
      z_old = z_old - (z_old * p_nm2 - _maxit) /
                      (((auVar8._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,
                                         (int)points.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage) -
                       4503599627370496.0)) * p_nm2);
      std::abs((int)this_00);
      if (extraout_XMM0_Qa <= 2.220446049250313e-16) {
        it._3_1_ = 1;
        break;
      }
    }
    pVar1 = z_old;
    if ((it._3_1_ & 1) == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Gauss-Lobatto Newton Iterations Failed to Converge");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    dVar5 = (double)mid / (p_nm2 * p_nm2);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,(size_type)i);
    *pvVar4 = pVar1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,(size_type)i);
    *pvVar4 = dVar5;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_30,
                        (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + (-1 - (long)i));
    *pvVar4 = -pVar1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_60,
                        (long)points.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + (-1 - (long)i));
    *pvVar4 = dVar5;
    i = (point_type)((long)i + 1);
  } while( true );
}

Assistant:

inline static std::tuple<point_container, weight_container> generate(
      size_t npts) {
    point_container points(npts);
    weight_container weights(npts);

    // Absolute precision for the nodes
    const auto eps = std::numeric_limits<double>::epsilon();

    // 2/(n(n-1)) appears in many expressions
    weight_type two_ov_nnm1 = 2.0 / (npts * (npts - 1.0));

    // Since the rules are symmetric around the origin, we only need
    // to compute one half of the points
    const size_t mid = (npts+1) / 2;
    for(size_t idx = 1; idx < mid; ++idx) {
      // Initial guess
      const point_type i = npts - 1 - idx;
      point_type z = cos (i * M_PI / ( npts - 1.0));

      // Old value of root
      point_type z_old = -2.0;
      // Values of P_{n-1}(x), dP_{n-1}/dx, P_{n-2}(x)
      point_type p_nm1, p_nm2;

      // Solve the root to eps absolute precision
      bool converged = false;
      const int maxit = 100;
      for(int it = 0; it < maxit; ++it) {
        // Evaluate the Legendre polynomial at z and its derivative
        std::tie(p_nm1, std::ignore, p_nm2) = IntegratorXX::eval_Pn(z, npts - 1);

        // Newton update for the root. This equation might look
        // peculiar, but it is correct: you can derive it by using
        // Newton's method to search for the roots of f(x) = (x^2-1)
        // P_{n}'(x), and using the differential equation satisfied by
        // the Legendre polynomials to find that f'(x) = n(n+1)
        // P_{n}(x).
        z_old = z;
        z -= (z*p_nm1 - p_nm2) / (npts*p_nm1);
        // Convergence check
        if(std::abs(z - z_old) <= eps) {
          converged = true;
          break;
        }
      }  // end while

      if(not converged) {
        throw std::runtime_error(
            "Gauss-Lobatto Newton Iterations Failed to Converge");
      }

      // Quadrature node is z
      point_type pt = z;
      // Quadrature weight is 2 / [n (n-1) (1-x^2) P_{n-1}(x)^2]
      weight_type wgt = two_ov_nnm1 / (p_nm1 * p_nm1);

      // Store the symmetric points
      points[idx] = pt;
      weights[idx] = wgt;

      points[npts - 1 - idx] = -pt;
      weights[npts - 1 - idx] = wgt;
    }  // Loop over points

    // Nodes and weights of the end points
    points[0] = -1.0;
    weights[0] = two_ov_nnm1;
    points[npts - 1] = 1.0;
    weights[npts - 1] = two_ov_nnm1;

    if(npts%2==1) {
      // Rule with even number of points has a node at the origin
      points[npts/2]=0.0;
    }

    return std::make_tuple(points, weights);
  }